

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int mmi_ci_train(model_inventory_t *inv,model_def_t *mdef,lexicon_t *lex,vector_t **f,
                s3lattice_t *lat,float64 a_beam,uint32 mean_reest,uint32 var_reest,feat_t *fcb)

{
  s3arc_s *psVar1;
  model_inventory_t *inv_00;
  int32 iVar2;
  vector_t **pppfVar3;
  state_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint32 n_state;
  model_inventory_t *local_68;
  uint32 local_5c;
  model_def_t *local_58;
  lexicon_t *local_50;
  float64 local_48;
  ulong local_40;
  float64 log_lik;
  
  n_state = 0;
  local_68 = inv;
  local_5c = mean_reest;
  local_58 = mdef;
  local_50 = lex;
  local_48 = a_beam;
  printf(" %5u",(ulong)lat->n_arcs);
  inv_00 = local_68;
  if (lat->n_arcs != 0) {
    uVar6 = 0;
    do {
      iVar7 = lat->arc[uVar6].ef - lat->arc[uVar6].sf;
      local_40 = uVar6;
      pppfVar3 = (vector_t **)
                 __ckd_calloc__((ulong)(iVar7 + 1),8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                ,0x5a3);
      uVar8 = iVar7 + 1;
      if (uVar8 != 0) {
        uVar5 = 0;
        do {
          pppfVar3[uVar5] = f[(lat->arc[uVar6].sf + (int)uVar5) - 1];
          uVar5 = uVar5 + 1;
        } while (uVar8 != uVar5);
      }
      psVar4 = next_utt_states(&n_state,local_50,inv_00,local_58,lat->arc[uVar6].word);
      iVar2 = mmi_viterbi_run(&log_lik,pppfVar3,uVar8,psVar4,n_state,inv_00,local_48);
      if (iVar2 == 0) {
        psVar1 = lat->arc;
        psVar1[uVar6].good_arc = 1;
        psVar1[uVar6].ac_score = log_lik;
      }
      ckd_free(pppfVar3);
      uVar5 = local_40;
      if (lat->arc[uVar6].good_arc == 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x5b7,"arc_%d is ignored (viterbi run failed)\n",(ulong)((int)local_40 + 1));
      }
      uVar6 = uVar5 + 1;
    } while (uVar6 < lat->n_arcs);
  }
  lat_fwd_bwd(lat);
  if (lat->n_arcs != 0) {
    uVar6 = 0;
    do {
      psVar1 = lat->arc;
      if (psVar1[uVar6].good_arc == 1) {
        iVar7 = psVar1[uVar6].ef - psVar1[uVar6].sf;
        pppfVar3 = (vector_t **)
                   __ckd_calloc__((ulong)(iVar7 + 1),8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                  ,0x5c6);
        uVar8 = iVar7 + 1;
        if (uVar8 != 0) {
          uVar5 = 0;
          do {
            pppfVar3[uVar5] = f[(lat->arc[uVar6].sf + (int)uVar5) - 1];
            uVar5 = uVar5 + 1;
          } while (uVar8 != uVar5);
        }
        psVar4 = next_utt_states(&n_state,local_50,local_68,local_58,lat->arc[uVar6].word);
        iVar2 = mmi_viterbi_update(pppfVar3,uVar8,psVar4,n_state,local_68,local_48,local_5c,
                                   var_reest,lat->arc[uVar6].gamma,fcb);
        if (iVar2 != 0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                  ,0x5d6,"arc_%d is ignored (viterbi update failed)\n",(ulong)((int)uVar6 + 1));
        }
        ckd_free(pppfVar3);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < lat->n_arcs);
  }
  return 0;
}

Assistant:

int
mmi_ci_train(model_inventory_t *inv,
	     model_def_t *mdef,
	     lexicon_t *lex,
	     vector_t **f,
	     s3lattice_t *lat,
	     float64 a_beam,
	     uint32 mean_reest,
	     uint32 var_reest,
	     feat_t *fcb)
{
  uint32 k, n;
  vector_t **arc_f = NULL;/* feature vector for a word arc */
  uint32 n_word_obs;/* frames of a word arc */
  state_t *state_seq;/* HMM state sequence for an arc */
  uint32 n_state = 0;/* number of HMM states */
  float64 log_lik;/* log-likelihood of an arc */
  
  /* viterbi run on each arc */
  printf(" %5u", lat->n_arcs);

  for(n=0; n<lat->n_arcs; n++) {
    
    /* total observations of this arc */
    /* this is not very accurate, as it consumes one more frame for each word at the end */
    n_word_obs = lat->arc[n].ef - lat->arc[n].sf + 1;
    
    /* get the feature for this arc */
    arc_f = (vector_t **) ckd_calloc(n_word_obs, sizeof(vector_t *));
    for (k=0; k<n_word_obs; k++)
      arc_f[k] = f[k+lat->arc[n].sf-1];
    
    /* make state list */
    state_seq = next_utt_states(&n_state, lex, inv, mdef, lat->arc[n].word);
    
    /* viterbi compuation to get the acoustic score for a word hypothesis */
    if (mmi_viterbi_run(&log_lik,
			arc_f, n_word_obs,
			state_seq, n_state,
			inv,
			a_beam) == S3_SUCCESS) {
      lat->arc[n].good_arc = 1;
      lat->arc[n].ac_score = log_lik;
    }
    
    ckd_free(arc_f);
    
    if (lat->arc[n].good_arc == 0) {
      E_INFO("arc_%d is ignored (viterbi run failed)\n", n+1);
    }
  }
  
  /* lattice-based forward-backward computation */
  lat_fwd_bwd(lat);
  
  /* update Gaussian parameters */
  for (n=0; n<lat->n_arcs; n++) {
    
    /* only if the arc was successful in viterbi run */
    if (lat->arc[n].good_arc == 1) {
      
      /* total observations of this arc */
      n_word_obs = lat->arc[n].ef - lat->arc[n].sf + 1;
      arc_f = (vector_t **) ckd_calloc(n_word_obs, sizeof(vector_t *));
      for (k=0; k<n_word_obs; k++)
	arc_f[k] = f[k+lat->arc[n].sf-1];
      
      /* make state list */
      state_seq = next_utt_states(&n_state, lex, inv, mdef, lat->arc[n].word);
      
      /* viterbi update model parameters */
      if (mmi_viterbi_update(arc_f, n_word_obs,
			     state_seq, n_state,
			     inv,
			     a_beam,
			     mean_reest,
			     var_reest,
			     lat->arc[n].gamma,
			     fcb) != S3_SUCCESS) {
	E_ERROR("arc_%d is ignored (viterbi update failed)\n", n+1);
      }
      
      ckd_free(arc_f);
    }
  }
  
  return S3_SUCCESS;
}